

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O1

RenderPassVkImpl * __thiscall
Diligent::RenderPassCache::GetRenderPass(RenderPassCache *this,RenderPassCacheKey *Key)

{
  ostream *poVar1;
  SHADING_RATE_FORMAT SVar2;
  byte bVar3;
  Uint8 UVar4;
  bool bVar5;
  TEXTURE_FORMAT TVar6;
  RenderDeviceVkImpl *pRVar7;
  AttachmentReference *pAVar8;
  RenderPassAttachmentDesc *pRVar9;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> RVar10;
  int iVar11;
  _Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
  _Var12;
  long lVar13;
  AttachmentReference *pAVar14;
  ostream *poVar15;
  TextureFormatAttribs *pTVar16;
  size_t sVar17;
  char (*in_RCX) [39];
  ulong uVar18;
  TEXTURE_FORMAT TVar19;
  unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>_>
  *this_00;
  RenderPassVkImpl *pRVar20;
  AttachmentReference *pAVar21;
  char *pcVar22;
  ulong uVar23;
  ulong uVar24;
  pthread_mutex_t *__mutex;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_false,_true>,_bool>
  pVar25;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> pRenderPass;
  RenderPassDesc RPDesc;
  string msg_2;
  string PassName;
  ShadingRateAttachment ShadingRate;
  array<Diligent::RenderPassAttachmentDesc,_10UL> Attachments;
  SubpassDesc Subpass;
  array<Diligent::AttachmentReference,_10UL> AttachmentReferences;
  stringstream PassNameSS;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> local_3b0;
  pthread_mutex_t *local_3a8;
  Uint32 local_3a0 [2];
  RenderPassCache *local_398;
  RenderPassDesc local_390;
  _Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_358;
  _Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
  local_350;
  string local_348;
  long *local_328;
  long local_318 [2];
  ShadingRateAttachment local_308;
  RenderPassAttachmentDesc local_2f0 [10];
  SubpassDesc local_250;
  AttachmentReference local_208 [10];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  iVar11 = pthread_mutex_lock(__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  this_00 = &this->m_Cache;
  local_398 = this;
  _Var12._M_cur =
       (__node_type *)
       std::
       _Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,_std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find(&this_00->_M_h,Key);
  if (_Var12._M_cur == (__node_type *)0x0) {
    lVar13 = 0;
    do {
      *(undefined2 *)((long)&local_2f0[0].Format + lVar13) = 0;
      (&local_2f0[0].SampleCount)[lVar13] = '\x01';
      *(undefined8 *)((long)&local_2f0[0].InitialState + lVar13) = 0;
      *(undefined4 *)(&local_2f0[0].LoadOp + lVar13) = 0;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xa0);
    local_208[8].AttachmentIndex = 0;
    local_208[8].State = RESOURCE_STATE_UNKNOWN;
    local_208[9].AttachmentIndex = 0;
    local_208[9].State = RESOURCE_STATE_UNKNOWN;
    local_208[6].AttachmentIndex = 0;
    local_208[6].State = RESOURCE_STATE_UNKNOWN;
    local_208[7].AttachmentIndex = 0;
    local_208[7].State = RESOURCE_STATE_UNKNOWN;
    local_208[4].AttachmentIndex = 0;
    local_208[4].State = RESOURCE_STATE_UNKNOWN;
    local_208[5].AttachmentIndex = 0;
    local_208[5].State = RESOURCE_STATE_UNKNOWN;
    local_208[2].AttachmentIndex = 0;
    local_208[2].State = RESOURCE_STATE_UNKNOWN;
    local_208[3].AttachmentIndex = 0;
    local_208[3].State = RESOURCE_STATE_UNKNOWN;
    local_208[0].AttachmentIndex = 0;
    local_208[0].State = RESOURCE_STATE_UNKNOWN;
    local_208[1].AttachmentIndex = 0;
    local_208[1].State = RESOURCE_STATE_UNKNOWN;
    local_3a8 = __mutex;
    local_358 = (_Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)this_00;
    local_350._M_cur = _Var12._M_cur;
    if (Key->EnableVRS == true) {
      pRVar7 = local_398->m_DeviceVkImpl;
      SVar2 = (pRVar7->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
              Format;
      if (SVar2 == SHADING_RATE_FORMAT_PALETTE) {
        TVar19 = TEX_FORMAT_R8_UINT;
      }
      else if (SVar2 == SHADING_RATE_FORMAT_UNORM8) {
        TVar19 = TEX_FORMAT_RG8_UNORM;
      }
      else {
        FormatString<char[31]>((string *)local_1b8,(char (*) [31])"Unexpected shading rate format");
        in_RCX = (char (*) [39])0xd4;
        DebugAssertionFailed
                  ((Char *)local_1b8._0_8_,"GetRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                   ,0xd4);
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        TVar19 = TEX_FORMAT_UNKNOWN;
      }
      local_3a0 = *&(pRVar7->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate
                    .MaxTileSize;
    }
    else {
      TVar19 = TEX_FORMAT_UNKNOWN;
      local_3a0[0] = 0;
      local_3a0[1] = 0;
    }
    local_250.InputAttachmentCount = 0;
    local_250.pInputAttachments = (AttachmentReference *)0x0;
    local_250.RenderTargetAttachmentCount = 0;
    local_250.pRenderTargetAttachments = (AttachmentReference *)0x0;
    local_250.pResolveAttachments._0_4_ = 0;
    local_250.pResolveAttachments._4_4_ = 0;
    local_250.pDepthStencilAttachment._0_4_ = 0;
    local_250.pDepthStencilAttachment._4_4_ = 0;
    local_250.PreserveAttachmentCount = 0;
    local_250.pPreserveAttachments = (Uint32 *)0x0;
    local_250.pShadingRateAttachment = (ShadingRateAttachment *)0x0;
    local_308.Attachment.AttachmentIndex = 0;
    local_308.Attachment.State = RESOURCE_STATE_UNKNOWN;
    local_308.TileSize[0] = 0;
    local_308.TileSize[1] = 0;
    bVar3 = Key->NumRenderTargets;
    TVar6 = Key->DSVFormat;
    UVar4 = Key->SampleCount;
    bVar5 = Key->ReadOnlyDSV;
    if (8 < bVar3) {
      FormatString<char[26],char[39]>
                ((string *)local_1b8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"NumRenderTargets <= MAX_RENDER_TARGETS",in_RCX);
      DebugAssertionFailed
                ((Char *)local_1b8._0_8_,"GetImplicitRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                 ,0x53);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
    }
    pAVar14 = (AttachmentReference *)0x0;
    local_390.super_DeviceObjectAttribs.Name = (Char *)0x0;
    if (TVar6 != TEX_FORMAT_UNKNOWN) {
      local_2f0[0].InitialState = (uint)bVar5 * 0x40 + RESOURCE_STATE_DEPTH_WRITE;
      local_2f0[0].LoadOp = ATTACHMENT_LOAD_OP_LOAD;
      local_2f0[0].StoreOp = ATTACHMENT_STORE_OP_STORE;
      local_2f0[0].StencilLoadOp = ATTACHMENT_LOAD_OP_LOAD;
      local_2f0[0].StencilStoreOp = ATTACHMENT_STORE_OP_STORE;
      pAVar14 = local_208;
      local_208[0] = (AttachmentReference)((ulong)local_2f0[0].InitialState << 0x20);
      local_2f0[0].Format = TVar6;
      local_2f0[0].SampleCount = UVar4;
      local_2f0[0].FinalState = local_2f0[0].InitialState;
    }
    uVar18 = (ulong)(TVar6 != TEX_FORMAT_UNKNOWN);
    pAVar21 = local_208 + uVar18;
    uVar24 = uVar18;
    pAVar8 = (AttachmentReference *)0x0;
    if (bVar3 != 0) {
      uVar23 = 0;
      do {
        if (Key->RTVFormats[uVar23] == TEX_FORMAT_UNKNOWN) {
          pAVar21[uVar23].AttachmentIndex = 0xffffffff;
        }
        else {
          local_2f0[uVar24].Format = Key->RTVFormats[uVar23];
          local_2f0[uVar24].SampleCount = UVar4;
          pRVar9 = local_2f0 + uVar24;
          pRVar9->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
          pRVar9->StoreOp = ATTACHMENT_STORE_OP_STORE;
          pRVar9->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
          pRVar9->StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
          local_2f0[uVar24].InitialState = RESOURCE_STATE_RENDER_TARGET;
          local_2f0[uVar24].FinalState = RESOURCE_STATE_RENDER_TARGET;
          pAVar21[uVar23].AttachmentIndex = (Uint32)uVar24;
          local_208[uVar18 + uVar23].State = RESOURCE_STATE_RENDER_TARGET;
          uVar24 = (ulong)((Uint32)uVar24 + 1);
        }
        uVar23 = uVar23 + 1;
        pAVar8 = pAVar21;
      } while ((uint)bVar3 != uVar23);
    }
    local_390.AttachmentCount = (Uint32)uVar24;
    if (TVar19 != TEX_FORMAT_UNKNOWN) {
      local_2f0[uVar24].Format = TVar19;
      pRVar9 = local_2f0 + uVar24;
      pRVar9->SampleCount = '\x01';
      pRVar9->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
      pRVar9->StoreOp = ATTACHMENT_STORE_OP_DISCARD;
      pRVar9->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
      local_2f0[uVar24].StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
      local_2f0[uVar24].InitialState = RESOURCE_STATE_MAX_BIT;
      local_2f0[uVar24].FinalState = RESOURCE_STATE_MAX_BIT;
      local_250.pShadingRateAttachment = &local_308;
      local_308.Attachment.State = RESOURCE_STATE_MAX_BIT;
      local_308.Attachment.AttachmentIndex = local_390.AttachmentCount;
      local_308.TileSize[0] = local_3a0[0];
      local_308.TileSize[1] = local_3a0[1];
      local_390.AttachmentCount = local_390.AttachmentCount + 1;
    }
    local_390.pAttachments = local_2f0;
    local_390.SubpassCount = 1;
    local_390.pSubpasses = &local_250;
    local_390.DependencyCount = 0;
    local_390.pDependencies = (SubpassDependencyDesc *)0x0;
    local_250.InputAttachmentCount = 0;
    local_250.pInputAttachments = (AttachmentReference *)0x0;
    local_250.pResolveAttachments._0_4_ = 0;
    local_250.pResolveAttachments._4_4_ = 0;
    local_250.pDepthStencilAttachment._0_4_ = SUB84(pAVar14,0);
    local_250.pDepthStencilAttachment._4_4_ = (undefined4)((ulong)pAVar14 >> 0x20);
    local_250.PreserveAttachmentCount = 0;
    local_250.pPreserveAttachments = (Uint32 *)0x0;
    local_250.RenderTargetAttachmentCount = (uint)bVar3;
    local_250.pRenderTargetAttachments = pAVar8;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar1 = (ostream *)(local_1b8 + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Implicit render pass: RT count: ",0x20);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"; sample count: ",0x10);
    poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"; DSV Format: ",0xe);
    pTVar16 = GetTextureFormatAttribs(Key->DSVFormat);
    pcVar22 = pTVar16->Name;
    if (pcVar22 == (char *)0x0) {
      std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
    }
    else {
      sVar17 = strlen(pcVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar22,sVar17);
    }
    UVar4 = Key->NumRenderTargets;
    if (UVar4 != '\0') {
      pcVar22 = "; RTV Formats: ";
      if (UVar4 == '\x01') {
        pcVar22 = "; RTV Format: ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,pcVar22,(ulong)(UVar4 == '\x01') ^ 0xf);
      if (Key->NumRenderTargets != '\0') {
        uVar24 = 0;
        do {
          pcVar22 = ", ";
          if (uVar24 == 0) {
            pcVar22 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1,pcVar22,(ulong)((uint)(uVar24 != 0) * 2));
          pTVar16 = GetTextureFormatAttribs(Key->RTVFormats[uVar24]);
          pcVar22 = pTVar16->Name;
          if (pcVar22 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(local_1a8[0]._M_allocated_capacity - 0x18) +
                            (int)poVar1);
          }
          else {
            sVar17 = strlen(pcVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar22,sVar17);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < Key->NumRenderTargets);
      }
    }
    if (Key->EnableVRS == true) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; VRS",5);
    }
    std::__cxx11::stringbuf::str();
    __mutex = local_3a8;
    local_390.super_DeviceObjectAttribs.Name = (Char *)local_328;
    local_3b0.m_pObject = (RenderPassVkImpl *)0x0;
    RenderDeviceVkImpl::CreateRenderPass
              (local_398->m_DeviceVkImpl,&local_390,(IRenderPass **)&local_3b0,true);
    _Var12._M_cur = local_350._M_cur;
    RVar10.m_pObject = local_3b0.m_pObject;
    if (local_3b0.m_pObject == (RenderPassVkImpl *)0x0) {
      FormatString<char[29]>(&local_348,(char (*) [29])"Failed to create render pass");
      DebugAssertionFailed
                (local_348._M_dataplus._M_p,"GetRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                 ,0xf4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pVar25 = std::
               _Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<Diligent::RenderPassCache::RenderPassCacheKey_const&,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>
                         (local_358,Key,&local_3b0);
      _Var12._M_cur =
           (__node_type *)
           pVar25.first.
           super__Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
           ._M_cur;
    }
    RefCntAutoPtr<Diligent::RenderPassVkImpl>::Release(&local_3b0);
    if (local_328 != local_318) {
      operator_delete(local_328,local_318[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if (RVar10.m_pObject == (RenderPassVkImpl *)0x0) {
      pRVar20 = (RenderPassVkImpl *)0x0;
      goto LAB_00245766;
    }
  }
  pRVar20 = *(RenderPassVkImpl **)
             ((long)&((_Var12._M_cur)->
                     super__Hash_node_value<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>
                     ._M_storage._M_storage + 0x20);
LAB_00245766:
  pthread_mutex_unlock(__mutex);
  return pRVar20;
}

Assistant:

RenderPassVkImpl* RenderPassCache::GetRenderPass(const RenderPassCacheKey& Key)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    auto                        it = m_Cache.find(Key);
    if (it == m_Cache.end())
    {
        // Do not zero-initialize arrays
        std::array<RenderPassAttachmentDesc, MAX_RENDER_TARGETS + 2> Attachments;
        std::array<AttachmentReference, MAX_RENDER_TARGETS + 2>      AttachmentReferences;

        TEXTURE_FORMAT SRFormat = TEX_FORMAT_UNKNOWN;
        uint2          SRTileSize;
        if (Key.EnableVRS)
        {
            const ShadingRateProperties& SRProps = m_DeviceVkImpl.GetAdapterInfo().ShadingRate;
            switch (SRProps.Format)
            {
                case SHADING_RATE_FORMAT_PALETTE: SRFormat = TEX_FORMAT_R8_UINT; break;
                case SHADING_RATE_FORMAT_UNORM8: SRFormat = TEX_FORMAT_RG8_UNORM; break;
                default:
                    UNEXPECTED("Unexpected shading rate format");
            }
            SRTileSize = {SRProps.MaxTileSize[0], SRProps.MaxTileSize[1]};
        }

        SubpassDesc           Subpass;
        ShadingRateAttachment ShadingRate;

        RenderPassDesc RPDesc = GetImplicitRenderPassDesc(Key.NumRenderTargets, Key.RTVFormats, Key.DSVFormat, Key.ReadOnlyDSV, Key.SampleCount,
                                                          SRFormat, SRTileSize, Attachments, AttachmentReferences, Subpass, ShadingRate);

        std::stringstream PassNameSS;
        PassNameSS << "Implicit render pass: RT count: " << Uint32{Key.NumRenderTargets} << "; sample count: " << Uint32{Key.SampleCount}
                   << "; DSV Format: " << GetTextureFormatAttribs(Key.DSVFormat).Name;
        if (Key.NumRenderTargets > 0)
        {
            PassNameSS << (Key.NumRenderTargets > 1 ? "; RTV Formats: " : "; RTV Format: ");
            for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            {
                PassNameSS << (rt > 0 ? ", " : "") << GetTextureFormatAttribs(Key.RTVFormats[rt]).Name;
            }
        }
        if (Key.EnableVRS)
            PassNameSS << "; VRS";

        const std::string PassName{PassNameSS.str()};
        RPDesc.Name = PassName.c_str();

        RefCntAutoPtr<RenderPassVkImpl> pRenderPass;
        m_DeviceVkImpl.CreateRenderPass(RPDesc, pRenderPass.RawDblPtr<IRenderPass>(), /* IsDeviceInternal = */ true);
        if (pRenderPass == nullptr)
        {
            UNEXPECTED("Failed to create render pass");
            return nullptr;
        }
        it = m_Cache.emplace(Key, std::move(pRenderPass)).first;
    }

    return it->second;
}